

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::SkipWS(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
         *this,bool skip_cr)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  eval_error *this_00;
  byte *pbVar4;
  bool bVar5;
  bool bVar6;
  string local_58;
  File_Position local_38;
  
  bVar5 = false;
  do {
    pbVar4 = (byte *)(this->m_position).m_pos;
    pbVar2 = (byte *)(this->m_position).m_end;
    if (pbVar4 == pbVar2) {
      return bVar5;
    }
    if (0x7e < *pbVar4) {
      this_00 = (eval_error *)__cxa_allocate_exception(0x90);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Illegal character","");
      local_38.line = (this->m_position).line;
      local_38.column = (this->m_position).col;
      exception::eval_error::eval_error
                (this_00,&local_58,&local_38,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    pbVar3 = pbVar4;
    if (pbVar4 == pbVar2) {
      pbVar3 = (byte *)0x4dc647;
    }
    bVar1 = *pbVar3;
    if (bVar1 == 10) {
      bVar6 = true;
    }
    else if (bVar1 == 0xd) {
      pbVar4 = pbVar4 + (pbVar4 != pbVar2);
      if (pbVar4 == pbVar2) {
        pbVar4 = (byte *)0x4dc647;
      }
      bVar6 = *pbVar4 == 10;
    }
    else {
      bVar6 = false;
    }
    if ((m_alphabet._M_elems[9]._M_elems[bVar1] == false) && ((skip_cr & bVar6) == 0)) {
      bVar6 = SkipComment(this);
      if (bVar6) goto LAB_004936bc;
      bVar6 = false;
    }
    else {
      if (bVar6 == true && bVar1 == 0xd) {
        Position::operator++(&this->m_position);
      }
      Position::operator++(&this->m_position);
LAB_004936bc:
      bVar5 = true;
      bVar6 = true;
    }
    if (!bVar6) {
      return bVar5;
    }
  } while( true );
}

Assistant:

bool SkipWS(bool skip_cr = false) {
        bool retval = false;

        while (m_position.has_more()) {
          if (static_cast<unsigned char>(*m_position) > 0x7e) {
            throw exception::eval_error("Illegal character", File_Position(m_position.line, m_position.col), *m_filename);
          }
          auto end_line = (*m_position != 0) && ((*m_position == '\n') || (*m_position == '\r' && *(m_position + 1) == '\n'));

          if (char_in_alphabet(*m_position, detail::white_alphabet) || (skip_cr && end_line)) {
            if (end_line) {
              if (*m_position == '\r') {
                // discards lf
                ++m_position;
              }
            }

            ++m_position;

            retval = true;
          } else if (SkipComment()) {
            retval = true;
          } else {
            break;
          }
        }
        return retval;
      }